

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O1

void __thiscall cppcms::impl::cgi::http::async_read_headers(http *this,handler *h)

{
  time_t tVar1;
  
  tVar1 = time((time_t *)0x0);
  this->time_to_die_ = this->timeout_ + tVar1;
  add_to_watchdog(this);
  this->total_read_ = 0;
  async_read_some_headers(this,h);
  return;
}

Assistant:

virtual void async_read_headers(handler const &h)
		{
			#ifdef CPPCMS_NO_SO_SNDTIMO
			booster::system::error_code e;
			socket_.set_non_blocking_if_needed(true,e);
			if(e) { h(e); return; }
			#endif
			update_time();
			add_to_watchdog();
			total_read_ = 0;
			async_read_some_headers(h);
		}